

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O3

void __thiscall
cppcms::impl::cgi::connection::cgi_forwarder::on_post_data_read
          (cgi_forwarder *this,error_code *e,size_t len)

{
  mutable_buffer tmp;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_90;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_88;
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2> local_80 [8]
  ;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  buffer_impl<char_*> local_70;
  const_buffer local_40;
  
  if (e->_M_value != 0) {
    cleanup(this,(EVP_PKEY_CTX *)e);
    return;
  }
  (*((this->conn_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_connection[0x12])();
  local_70.size_ = 0;
  local_70.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  booster::aio::buffer_impl<char_*>::add
            (&local_70,
             (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,len);
  booster::aio::const_buffer::const_buffer(&local_40,(mutable_buffer *)&local_70);
  std::__shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,void>
            (local_80,(__weak_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>
                       *)this);
  mfunc_to_io_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
            ((offset_in_cgi_forwarder_to_subr)&local_90,
             (shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)on_post_data_written);
  local_88.p_ = local_90.p_;
  if (local_90.p_ != (callable<void_(const_std::error_code_&,_unsigned_long)> *)0x0) {
    booster::atomic_counter::inc();
  }
  booster::aio::stream_socket::async_write((const_buffer *)&this->scgi_,(callback *)&local_40);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_88);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_90);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_40.super_buffer_impl<const_char_*>.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super_buffer_impl<const_char_*>.vec_.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.vec_.
      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.vec_.
                    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void on_post_data_read(booster::system::error_code const &e,size_t len)
		{
			if(e)  { cleanup(); return; }
			conn_->on_async_read_complete();
			scgi_.async_write(
				booster::aio::buffer(&post_.front(),len),
				mfunc_to_io_handler(&cgi_forwarder::on_post_data_written,shared_from_this()));
		}